

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode Curl_hsts_loadcb(Curl_easy *data,hsts *h)

{
  hsts *h_local;
  Curl_easy *data_local;
  
  if (h == (hsts *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    data_local._4_4_ = hsts_pull(data,h);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_hsts_loadcb(struct Curl_easy *data, struct hsts *h)
{
  if(h)
    return hsts_pull(data, h);
  return CURLE_OK;
}